

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

bool absl::lts_20240722::str_format_internal::ConvertIntArg<absl::lts_20240722::int128>
               (int128 v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  int128 v_00;
  int128 v_01;
  int128 v_02;
  int128 v_03;
  int128 v_04;
  FormatConversionChar FVar1;
  LengthMod LVar2;
  char cVar3;
  bool bVar4;
  wchar_t wVar5;
  undefined4 in_ECX;
  undefined8 uVar6;
  FormatSinkImpl *in_R8;
  double v_05;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  string_view v_06;
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  bool local_191;
  uint128 local_138;
  undefined8 local_128;
  undefined8 local_120;
  uint128 local_118;
  undefined8 local_108;
  undefined8 local_100;
  uint128 local_f8;
  undefined8 local_e8;
  undefined8 local_e0;
  uint128 local_d8;
  FormatSinkImpl *local_c8;
  undefined1 local_c0 [16];
  undefined1 local_b0 [12];
  undefined1 local_a4 [16];
  undefined1 local_94 [4];
  undefined1 local_90 [8];
  IntDigits as_digits;
  FormatSinkImpl *sink_local;
  FormatSinkImpl *local_38;
  FormatConversionSpecImpl conv_local;
  int128 v_local;
  bool local_9;
  
  uVar6 = CONCAT44((int)((ulong)register0x00000030 >> 0x20),conv.precision_);
  register0x00000038 = conv._0_8_;
  as_digits._56_8_ = in_R8;
  local_38 = sink;
  conv_local._0_4_ = in_ECX;
  FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)&local_38);
  switch(FVar1) {
  case 0:
    LVar2 = FormatConversionSpecImpl::length_mod((FormatConversionSpecImpl *)&local_38);
    if (LVar2 == l) {
      wVar5 = int128::operator_cast_to_wchar_t((int128 *)&conv_local.precision_);
      local_a4._8_8_ = local_38;
      local_94[0] = conv_local.conv_;
      local_94[1] = conv_local.flags_;
      local_94[2] = conv_local.length_mod_;
      local_94[3] = conv_local._3_1_;
      local_b0._4_8_ = local_38;
      local_a4[0] = conv_local.conv_;
      local_a4[1] = conv_local.flags_;
      local_a4[2] = conv_local.length_mod_;
      local_a4[3] = conv_local._3_1_;
      conv_00.width_ = 0;
      conv_00.conv_ = conv_local.conv_;
      conv_00.flags_ = conv_local.flags_;
      conv_00.length_mod_ = conv_local.length_mod_;
      conv_00._3_1_ = conv_local._3_1_;
      conv_00.precision_ = as_digits.storage_._40_4_;
      local_191 = anon_unknown_53::ConvertWCharTImpl
                            ((anon_unknown_53 *)(ulong)(uint)wVar5,(wchar_t)local_38,conv_00,in_R8);
    }
    else {
      cVar3 = int128::operator_cast_to_char((int128 *)&conv_local.precision_);
      local_c0._8_8_ = local_38;
      local_b0[0] = conv_local.conv_;
      local_b0[1] = conv_local.flags_;
      local_b0[2] = conv_local.length_mod_;
      local_b0[3] = conv_local._3_1_;
      local_c8 = local_38;
      local_c0[0] = conv_local.conv_;
      local_c0[1] = conv_local.flags_;
      local_c0[2] = conv_local.length_mod_;
      local_c0[3] = conv_local._3_1_;
      conv_01.width_ = 0;
      conv_01.conv_ = conv_local.conv_;
      conv_01.flags_ = conv_local.flags_;
      conv_01.length_mod_ = conv_local.length_mod_;
      conv_01._3_1_ = conv_local._3_1_;
      conv_01.precision_ = as_digits.storage_._40_4_;
      local_191 = anon_unknown_53::ConvertCharImpl
                            ((anon_unknown_53 *)(ulong)(uint)(int)cVar3,(char)local_38,conv_01,in_R8
                            );
    }
    return local_191;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = absl::int128]"
                 );
  case 2:
  case 3:
  case 0x12:
    v_04.v_._8_8_ = in_stack_fffffffffffffe60;
    v_04.v_._0_8_ = in_stack_fffffffffffffe58;
    anon_unknown_53::IntDigits::PrintAsDec((IntDigits *)local_90,v_04);
    break;
  case 4:
    local_e8 = stack0xffffffffffffffd8;
    v_00.v_._8_8_ = in_stack_fffffffffffffe60;
    v_00.v_._0_8_ = in_stack_fffffffffffffe58;
    local_e0 = uVar6;
    uint128::uint128(&local_d8,v_00);
    anon_unknown_53::IntDigits::PrintAsOct<absl::lts_20240722::uint128>
              ((IntDigits *)local_90,local_d8);
    break;
  case 5:
    v_03.v_._8_8_ = in_stack_fffffffffffffe60;
    v_03.v_._0_8_ = in_stack_fffffffffffffe58;
    uint128::uint128(&local_138,v_03);
    anon_unknown_53::IntDigits::PrintAsDec((IntDigits *)local_90,local_138,false);
    break;
  case 6:
    local_108 = stack0xffffffffffffffd8;
    v_01.v_._8_8_ = in_stack_fffffffffffffe60;
    v_01.v_._0_8_ = in_stack_fffffffffffffe58;
    local_100 = uVar6;
    uint128::uint128(&local_f8,v_01);
    anon_unknown_53::IntDigits::PrintAsHexLower<absl::lts_20240722::uint128>
              ((IntDigits *)local_90,local_f8);
    break;
  case 7:
    local_128 = stack0xffffffffffffffd8;
    v_02.v_._8_8_ = in_stack_fffffffffffffe60;
    v_02.v_._0_8_ = in_stack_fffffffffffffe58;
    local_120 = uVar6;
    uint128::uint128(&local_118,v_02);
    anon_unknown_53::IntDigits::PrintAsHexUpper<absl::lts_20240722::uint128>
              ((IntDigits *)local_90,local_118);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    v_05 = int128::operator_cast_to_double((int128 *)&conv_local.precision_);
    bVar4 = ConvertFloatImpl(v_05,(FormatConversionSpecImpl *)&local_38,
                             (FormatSinkImpl *)as_digits._56_8_);
    return bVar4;
  }
  bVar4 = FormatConversionSpecImpl::is_basic((FormatConversionSpecImpl *)&local_38);
  if (bVar4) {
    v_06 = anon_unknown_53::IntDigits::with_neg_and_zero((IntDigits *)local_90);
    FormatSinkImpl::Append((FormatSinkImpl *)as_digits._56_8_,v_06);
    local_9 = true;
  }
  else {
    conv_02.width_ = 0;
    conv_02.conv_ = conv_local.conv_;
    conv_02.flags_ = conv_local.flags_;
    conv_02.length_mod_ = conv_local.length_mod_;
    conv_02._3_1_ = conv_local._3_1_;
    conv_02.precision_ = as_digits.storage_._40_4_;
    local_9 = anon_unknown_53::ConvertIntImplInnerSlow
                        ((anon_unknown_53 *)local_90,(IntDigits *)local_38,conv_02,in_R8);
  }
  return local_9;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}